

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t
exr_get_chunk_table(exr_const_context_t_conflict ctxt,int part_index,uint64_t **table,int32_t *count
                   )

{
  exr_result_t eVar1;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  uint64_t chunkmin;
  exr_result_t rv;
  undefined4 in_stack_00000030;
  exr_const_priv_part_t in_stack_00000040;
  exr_const_context_t_conflict in_stack_00000048;
  int32_t *in_stack_ffffffffffffffb8;
  exr_const_context_t_conflict in_stack_ffffffffffffffc0;
  exr_const_context_t_conflict in_stack_ffffffffffffffc8;
  exr_result_t local_2c;
  
  if (in_RDX == 0) {
    return 3;
  }
  local_2c = exr_get_chunk_count(in_stack_ffffffffffffffc8,
                                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 in_stack_ffffffffffffffb8);
  if (local_2c == 0) {
    if (in_RDI == (char *)0x0) {
      return 2;
    }
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffc0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
      eVar1 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      return eVar1;
    }
    local_2c = extract_chunk_table(in_stack_00000048,in_stack_00000040,(uint64_t **)ctxt,
                                   (uint64_t *)CONCAT44(part_index,in_stack_00000030));
    if (local_2c != 0) {
      return local_2c;
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_get_chunk_table (exr_const_context_t ctxt, int part_index, uint64_t **table, int32_t* count)
{
    exr_result_t rv;

    if (!table)
        return EXR_ERR_INVALID_ARGUMENT;

    rv = exr_get_chunk_count (ctxt, part_index, count);
    if (rv == EXR_ERR_SUCCESS)
    {
        uint64_t chunkmin;
        EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

        /* need to read from the file to get the packed chunk size */
        rv = extract_chunk_table (ctxt, part, table, &chunkmin);

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    return rv;
}